

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O2

err_t belsGenMid(octet *mid,size_t len,octet *m0,octet *id,size_t id_len)

{
  u64 *dest;
  void *state;
  bool_t bVar1;
  size_t sVar2;
  size_t sVar3;
  u64 *dest_00;
  long *plVar4;
  err_t eVar5;
  long lVar6;
  word *b;
  ulong n;
  
  eVar5 = 0x6d;
  if ((len < 0x21) && ((0x101010000U >> (len & 0x3f) & 1) != 0)) {
    bVar1 = memIsValid(m0,len);
    if (bVar1 != 0) {
      bVar1 = memIsValid(mid,len);
      if (bVar1 != 0) {
        bVar1 = memIsValid(id,id_len);
        if (bVar1 != 0) {
          n = len >> 3;
          sVar2 = beltHash_keep();
          sVar3 = ppMinPolyMod_deep(n + 1);
          sVar2 = utilMax(2,sVar2,sVar3);
          dest_00 = (u64 *)blobCreate(sVar2 + len * 2 + 0x38);
          if (dest_00 == (u64 *)0x0) {
            eVar5 = 0x6e;
          }
          else {
            b = (word *)((long)dest_00 + len + 8);
            plVar4 = (long *)((long)dest_00 + len * 2 + 8);
            dest = (u64 *)((long)dest_00 + len * 2 + 0x10);
            state = (void *)((long)dest_00 + len * 2 + 0x38);
            u64From(dest_00,m0,len);
            *(undefined8 *)((long)dest_00 + len) = 1;
            beltHashStart(state);
            beltHashStepH(id,id_len,state);
            beltHashStepG((octet *)dest,state);
            u64From(dest,dest,0x20);
            *(undefined8 *)(len + 8 + (long)plVar4) = 0;
            for (lVar6 = -3; lVar6 != 0; lVar6 = lVar6 + 1) {
              ppMinPolyMod(b,dest,dest_00,n + 1,state);
              if (*plVar4 == 1) {
                bVar1 = wwEq(b,dest_00,n);
                if (bVar1 == 0) {
                  u64To(mid,len,b);
                  eVar5 = 0;
                  goto LAB_00125c05;
                }
              }
              zzAddW2(dest,n,1);
            }
            eVar5 = 0x1f9;
LAB_00125c05:
            blobClose(dest_00);
          }
        }
      }
    }
  }
  return eVar5;
}

Assistant:

err_t belsGenMid(octet mid[], size_t len, const octet m0[], const octet id[], 
	size_t id_len)
{
	size_t n, reps;
	void* state;
	word* f0;
	word* f;
	word* u;
	void* stack;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || 
		!memIsValid(m0, len) || !memIsValid(mid, len) || 
		!memIsValid(id, id_len))
		return ERR_BAD_INPUT;
	EXPECT(belsValM(m0, len) == ERR_OK);
	// создать состояние
	n = W_OF_O(len);
	state = blobCreate(O_OF_W(2 * n + 2) + 32 + O_PER_W +
		utilMax(2, 
			beltHash_keep(),
			ppMinPolyMod_deep(n + 1)));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	f0 = (word*)state;
	f = f0 + n + 1;
	u = f + n + 1;
	stack = u + W_OF_O(32) + 1;
	// загрузить многочлен
	wwFrom(f0, m0, len);
	f0[n] = 1;
	// хэшировать
	beltHashStart(stack);
	beltHashStepH(id, id_len, stack);
	beltHashStepG((octet*)u, stack);
	wwFrom(u, u, 32);
	u[n] = 0;
	// попытки генерации
	for (reps = MAX2(3, B_PER_IMPOSSIBLE * 2 / len / 8); reps--;)
	{
		// f <- минимальный многочлен элемента u
		ppMinPolyMod(f, u, f0, n + 1, stack);
		// f подходит?
		if (f[n] == 1 && !wwEq(f, f0, n))
		{
			wwTo(mid, len, f);
			break;
		}
		// u <- u + 1
		zzAddW2(u, n, 1);
	}
	// завершение
	blobClose(state);
	return reps != SIZE_MAX ? ERR_OK : ERR_BAD_PUBKEY;
}